

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_vertexbuffer.cpp
# Opt level: O3

void __thiscall
FFlatVertexBuffer::UpdatePlaneVertices(FFlatVertexBuffer *this,sector_t *sec,int plane)

{
  double dVar1;
  double dVar2;
  FFlatVertex *pFVar3;
  FFlatVertex *pFVar4;
  double dVar5;
  double dVar6;
  int iVar7;
  long lVar8;
  secplane_t *psVar9;
  float fVar10;
  
  iVar7 = sec->vbocount[plane];
  if (0 < iVar7) {
    pFVar3 = this->map;
    pFVar4 = (this->vbo_shadowdata).Array;
    psVar9 = &sec->ceilingplane;
    if (plane == 0) {
      psVar9 = &sec->floorplane;
    }
    dVar1 = psVar9->D;
    dVar5 = (psVar9->normal).X;
    dVar6 = (psVar9->normal).Y;
    dVar2 = psVar9->negiC;
    lVar8 = (long)sec->vboindex[plane] * 0x14;
    do {
      fVar10 = (float)(((double)*(float *)((long)&pFVar4->y + lVar8) * dVar6 +
                       (double)*(float *)((long)&pFVar4->x + lVar8) * dVar5 + dVar1) * dVar2);
      *(float *)((long)&pFVar4->z + lVar8) = fVar10;
      if ((plane == 0) && (sec->transdoor == true)) {
        fVar10 = fVar10 + -1.0;
        *(float *)((long)&pFVar4->z + lVar8) = fVar10;
      }
      *(float *)((long)&pFVar3->z + lVar8) = fVar10;
      lVar8 = lVar8 + 0x14;
      iVar7 = iVar7 + -1;
    } while (iVar7 != 0);
  }
  return;
}

Assistant:

void FFlatVertexBuffer::UpdatePlaneVertices(sector_t *sec, int plane)
{
	int startvt = sec->vboindex[plane];
	int countvt = sec->vbocount[plane];
	secplane_t &splane = sec->GetSecPlane(plane);
	FFlatVertex *vt = &vbo_shadowdata[startvt];
	FFlatVertex *mapvt = &map[startvt];
	for(int i=0; i<countvt; i++, vt++, mapvt++)
	{
		vt->z = splane.ZatPoint(vt->x, vt->y);
		if (plane == sector_t::floor && sec->transdoor) vt->z -= 1;
		mapvt->z = vt->z;
	}
}